

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sais.hxx
# Opt level: O2

void saisxx_private::
     induceSA<__gnu_cxx::__normal_iterator<long*,std::vector<long,std::allocator<long>>>,__gnu_cxx::__normal_iterator<long*,std::vector<long,std::allocator<long>>>,__gnu_cxx::__normal_iterator<long*,std::vector<long,std::allocator<long>>>,long>
               (__normal_iterator<long_*,_std::vector<long,_std::allocator<long>_>_> T,
               __normal_iterator<long_*,_std::vector<long,_std::allocator<long>_>_> SA,
               __normal_iterator<long_*,_std::vector<long,_std::allocator<long>_>_> C,
               __normal_iterator<long_*,_std::vector<long,_std::allocator<long>_>_> B,long n,long k)

{
  ulong uVar1;
  long *plVar2;
  long lVar3;
  long lVar4;
  long lVar5;
  long lVar6;
  long lVar7;
  
  if (C._M_current == B._M_current) {
    getCounts<__gnu_cxx::__normal_iterator<long*,std::vector<long,std::allocator<long>>>,__gnu_cxx::__normal_iterator<long*,std::vector<long,std::allocator<long>>>,long>
              (T,C,n,k);
  }
  getBuckets<__gnu_cxx::__normal_iterator<long*,std::vector<long,std::allocator<long>>>,long>
            (C,B,k,false);
  lVar7 = n + -1;
  lVar4 = T._M_current[n + -1];
  lVar5 = B._M_current[lVar4];
  lVar3 = lVar7;
  if ((1 < n) && (lVar3 = -n, lVar4 <= T._M_current[n + -2])) {
    lVar3 = lVar7;
  }
  SA._M_current[lVar5] = lVar3;
  plVar2 = SA._M_current + lVar5 + 1;
  lVar3 = 0;
  lVar5 = 0;
  if (0 < n) {
    lVar5 = n;
  }
  for (; lVar5 != lVar3; lVar3 = lVar3 + 1) {
    uVar1 = SA._M_current[lVar3];
    SA._M_current[lVar3] = ~uVar1;
    if (0 < (long)uVar1) {
      lVar6 = T._M_current[uVar1 - 1];
      if (lVar6 != lVar4) {
        B._M_current[lVar4] = (long)plVar2 - (long)SA._M_current >> 3;
        plVar2 = SA._M_current + B._M_current[lVar6];
        lVar4 = lVar6;
      }
      if (uVar1 == 1) {
        lVar6 = 0;
      }
      else {
        lVar6 = -uVar1;
        if (lVar4 <= T._M_current[uVar1 - 2]) {
          lVar6 = uVar1 - 1;
        }
      }
      *plVar2 = lVar6;
      plVar2 = plVar2 + 1;
    }
  }
  if (C._M_current == B._M_current) {
    getCounts<__gnu_cxx::__normal_iterator<long*,std::vector<long,std::allocator<long>>>,__gnu_cxx::__normal_iterator<long*,std::vector<long,std::allocator<long>>>,long>
              (T,C,n,k);
  }
  getBuckets<__gnu_cxx::__normal_iterator<long*,std::vector<long,std::allocator<long>>>,long>
            (C,B,k,true);
  plVar2 = SA._M_current + *B._M_current;
  lVar4 = 0;
  for (; -1 < lVar7; lVar7 = lVar7 + -1) {
    uVar1 = SA._M_current[lVar7];
    if ((long)uVar1 < 1) {
      SA._M_current[lVar7] = ~uVar1;
    }
    else {
      lVar5 = T._M_current[uVar1 - 1];
      if (lVar5 != lVar4) {
        B._M_current[lVar4] = (long)plVar2 - (long)SA._M_current >> 3;
        plVar2 = SA._M_current + B._M_current[lVar5];
        lVar4 = lVar5;
      }
      lVar5 = uVar1 - 1;
      if ((lVar5 == 0) || (lVar4 < T._M_current[uVar1 - 2])) {
        lVar5 = -uVar1;
      }
      plVar2[-1] = lVar5;
      plVar2 = plVar2 + -1;
    }
  }
  return;
}

Assistant:

void
induceSA(string_type T, sarray_type SA, bucket_type C, bucket_type B,
         index_type n, index_type k) {
typedef typename std::iterator_traits<string_type>::value_type char_type;
  sarray_type b;
  index_type i, j;
  char_type c0, c1;
  /* compute SAl */
  if(C == B) { getCounts(T, C, n, k); }
  getBuckets(C, B, k, false); /* find starts of buckets */
  b = SA + B[c1 = T[j = n - 1]];
  *b++ = ((0 < j) && (T[j - 1] < c1)) ? ~j : j;
  for(i = 0; i < n; ++i) {
    j = SA[i], SA[i] = ~j;
    if(0 < j) {
      if((c0 = T[--j]) != c1) { B[c1] = b - SA; b = SA + B[c1 = c0]; }
      *b++ = ((0 < j) && (T[j - 1] < c1)) ? ~j : j;
    }
  }
  /* compute SAs */
  if(C == B) { getCounts(T, C, n, k); }
  getBuckets(C, B, k, true); /* find ends of buckets */
  for(i = n - 1, b = SA + B[c1 = 0]; 0 <= i; --i) {
    if(0 < (j = SA[i])) {
      if((c0 = T[--j]) != c1) { B[c1] = b - SA; b = SA + B[c1 = c0]; }
      *--b = ((j == 0) || (T[j - 1] > c1)) ? ~j : j;
    } else {
      SA[i] = ~j;
    }
  }
}